

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int selectWindowRewriteExprCb(Walker *pWalker,Expr *pExpr)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  Parse *pPVar4;
  WindowRewrite *pWVar5;
  Expr *pExpr_00;
  ExprList *pEVar6;
  Window *pWVar7;
  int *piVar8;
  long lVar9;
  
  pPVar4 = pWalker->pParse;
  pWVar5 = (pWalker->u).pRewrite;
  bVar2 = pExpr->op;
  if (pWVar5->pSubSelect != (Select *)0x0) {
    if (bVar2 != 0xa2) {
      return 0;
    }
    iVar3 = pWVar5->pSrc->nSrc;
    lVar9 = 0;
    if (0 < (long)iVar3) {
      piVar8 = &pWVar5->pSrc->a[0].iCursor;
      lVar9 = 0;
      while (pExpr->iTable != *piVar8) {
        lVar9 = lVar9 + 1;
        piVar8 = piVar8 + 0x1c;
        if (iVar3 == lVar9) {
          return 0;
        }
      }
    }
    if ((int)lVar9 == iVar3) {
      return 0;
    }
  }
  if (1 < bVar2 - 0xa2) {
    if (bVar2 != 0xa1) {
      return 0;
    }
    if ((pExpr->flags & 0x1000000) == 0) {
      return 0;
    }
    pWVar7 = pWVar5->pWin;
    if (pWVar7 != (Window *)0x0) {
      do {
        if ((Window *)(pExpr->y).pTab == pWVar7) {
          return 1;
        }
        pWVar7 = pWVar7->pNextWin;
      } while (pWVar7 != (Window *)0x0);
    }
  }
  pExpr_00 = exprDup(pPVar4->db,pExpr,0,(u8 **)0x0);
  pEVar6 = sqlite3ExprListAppend((Parse *)pPVar4->db,pWVar5->pSub,pExpr_00);
  pWVar5->pSub = pEVar6;
  if (pEVar6 != (ExprList *)0x0) {
    pbVar1 = (byte *)((long)&pExpr->flags + 3);
    *pbVar1 = *pbVar1 | 8;
    sqlite3ExprDeleteNN(pPVar4->db,pExpr);
    pExpr->op = '\0';
    pExpr->affinity = '\0';
    *(undefined2 *)&pExpr->field_0x2 = 0;
    pExpr->flags = 0;
    (pExpr->u).zToken = (char *)0x0;
    pExpr->iColumn = 0;
    pExpr->iAgg = 0;
    pExpr->iRightJoinTable = 0;
    pExpr->op2 = '\0';
    pExpr->field_0x37 = 0;
    pExpr->pAggInfo = (AggInfo *)0x0;
    (pExpr->x).pList = (ExprList *)0x0;
    pExpr->nHeight = 0;
    pExpr->iTable = 0;
    pExpr->pLeft = (Expr *)0x0;
    pExpr->pRight = (Expr *)0x0;
    (pExpr->y).pTab = (Table *)0x0;
    pExpr->op = 0xa2;
    pExpr->iColumn = (short)pWVar5->pSub->nExpr + -1;
    pExpr->iTable = pWVar5->pWin->iEphCsr;
  }
  return 0;
}

Assistant:

static int selectWindowRewriteExprCb(Walker *pWalker, Expr *pExpr){
  struct WindowRewrite *p = pWalker->u.pRewrite;
  Parse *pParse = pWalker->pParse;

  /* If this function is being called from within a scalar sub-select
  ** that used by the SELECT statement being processed, only process
  ** TK_COLUMN expressions that refer to it (the outer SELECT). Do
  ** not process aggregates or window functions at all, as they belong
  ** to the scalar sub-select.  */
  if( p->pSubSelect ){
    if( pExpr->op!=TK_COLUMN ){
      return WRC_Continue;
    }else{
      int nSrc = p->pSrc->nSrc;
      int i;
      for(i=0; i<nSrc; i++){
        if( pExpr->iTable==p->pSrc->a[i].iCursor ) break;
      }
      if( i==nSrc ) return WRC_Continue;
    }
  }

  switch( pExpr->op ){

    case TK_FUNCTION:
      if( !ExprHasProperty(pExpr, EP_WinFunc) ){
        break;
      }else{
        Window *pWin;
        for(pWin=p->pWin; pWin; pWin=pWin->pNextWin){
          if( pExpr->y.pWin==pWin ){
            assert( pWin->pOwner==pExpr );
            return WRC_Prune;
          }
        }
      }
      /* Fall through.  */

    case TK_AGG_FUNCTION:
    case TK_COLUMN: {
      Expr *pDup = sqlite3ExprDup(pParse->db, pExpr, 0);
      p->pSub = sqlite3ExprListAppend(pParse, p->pSub, pDup);
      if( p->pSub ){
        assert( ExprHasProperty(pExpr, EP_Static)==0 );
        ExprSetProperty(pExpr, EP_Static);
        sqlite3ExprDelete(pParse->db, pExpr);
        ExprClearProperty(pExpr, EP_Static);
        memset(pExpr, 0, sizeof(Expr));

        pExpr->op = TK_COLUMN;
        pExpr->iColumn = p->pSub->nExpr-1;
        pExpr->iTable = p->pWin->iEphCsr;
      }

      break;
    }

    default: /* no-op */
      break;
  }

  return WRC_Continue;
}